

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int m_gt_1(char *z)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  
  do {
    pcVar2 = z;
    iVar1 = isVowel(pcVar2);
    z = pcVar2 + 1;
  } while (iVar1 != 0);
  uVar4 = 0;
  if (*pcVar2 != '\0') {
    pcVar2 = pcVar2 + -1;
    do {
      pcVar2 = pcVar2 + 1;
      iVar1 = isConsonant(pcVar2);
    } while (iVar1 != 0);
    if (*pcVar2 != '\0') {
      do {
        pcVar3 = pcVar2;
        iVar1 = isVowel(pcVar3);
        pcVar2 = pcVar3 + 1;
      } while (iVar1 != 0);
      if (*pcVar3 != '\0') {
        pcVar3 = pcVar3 + -1;
        do {
          pcVar3 = pcVar3 + 1;
          iVar1 = isConsonant(pcVar3);
        } while (iVar1 != 0);
        uVar4 = (uint)(*pcVar3 != '\0');
      }
    }
  }
  return uVar4;
}

Assistant:

static int m_gt_1(const char *z){
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  return *z!=0;
}